

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int validate_length_range
              (uint8_t kind,uint64_t unum,int64_t snum,int64_t fnum,uint8_t fnum_dig,lys_type *type,
              char *val_str,lyd_node *node)

{
  LY_DATA_TYPE LVar1;
  lys_restr *plVar2;
  bool bVar3;
  lys_type *plVar4;
  int iVar5;
  uint8_t dig1;
  lys_type *plVar6;
  ly_ctx *ctx;
  undefined7 in_register_00000081;
  char *pcVar7;
  undefined8 uVar8;
  len_ran_intv *plVar9;
  bool bVar10;
  len_ran_intv *local_58;
  len_ran_intv *intv;
  long local_48;
  ulong local_40;
  lys_type *local_38;
  
  local_38 = (lys_type *)CONCAT44(local_38._4_4_,(int)CONCAT71(in_register_00000081,fnum_dig));
  local_58 = (len_ran_intv *)0x0;
  ctx = type->parent->module->ctx;
  iVar5 = resolve_len_ran_interval(ctx,(char *)0x0,type,&local_58);
  plVar4 = local_38;
  if (iVar5 == 0) {
    if (local_58 == (len_ran_intv *)0x0) {
      return 0;
    }
    plVar6 = local_58->type;
    plVar9 = local_58;
    intv = (len_ran_intv *)ctx;
    local_48 = snum;
    local_40 = unum;
LAB_001264d1:
    bVar3 = true;
    bVar10 = plVar9 == (len_ran_intv *)0x0;
    if ((!bVar10) && (plVar9->type == plVar6)) {
      bVar3 = false;
      local_38 = plVar6;
      do {
        if (bVar3) {
LAB_001264f7:
          bVar3 = true;
        }
        else {
          if ((((kind == '\0') && (unum < (plVar9->value).uval.min)) ||
              ((kind == '\x01' && (snum < (plVar9->value).sval.min)))) ||
             ((dig1 = (uint8_t)plVar4, kind == '\x02' &&
              (iVar5 = dec64cmp(fnum,dig1,(plVar9->value).sval.min,(plVar6->info).dec64.dig),
              snum = local_48, unum = local_40, iVar5 < 0)))) goto LAB_001265f9;
          if ((((kind == '\0') &&
               (((plVar9->value).uval.min <= unum && (unum <= (plVar9->value).uval.max)))) ||
              ((kind == '\x01' &&
               (((plVar9->value).sval.min <= snum && (snum <= (plVar9->value).sval.max)))))) ||
             ((bVar3 = false, kind == '\x02' &&
              ((iVar5 = dec64cmp(fnum,dig1,(plVar9->value).sval.min,(plVar6->info).dec64.dig),
               snum = local_48, unum = local_40, plVar6 = local_38, -1 < iVar5 &&
               (iVar5 = dec64cmp(fnum,dig1,(plVar9->value).sval.max,(local_38->info).dec64.dig),
               snum = local_48, unum = local_40, plVar6 = local_38, iVar5 < 1))))))
          goto LAB_001264f7;
        }
        plVar9 = plVar9->next;
        bVar10 = plVar9 == (len_ran_intv *)0x0;
        if ((bVar10) || (plVar9->type != plVar6)) goto LAB_001265f9;
      } while( true );
    }
    goto LAB_00126600;
  }
  uVar8 = 0x206;
LAB_00126487:
  ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
         ,uVar8);
  return 1;
LAB_001265f9:
  bVar3 = !bVar3;
LAB_00126600:
  ctx = (ly_ctx *)intv;
  if ((bVar3) || (bVar10)) goto joined_r0x00126623;
  plVar6 = plVar9->type;
  goto LAB_001264d1;
joined_r0x00126623:
  while (intv = (len_ran_intv *)ctx, local_58 != (len_ran_intv *)0x0) {
    plVar9 = local_58->next;
    free(local_58);
    local_58 = plVar9;
    ctx = (ly_ctx *)intv;
  }
  if (!bVar3) {
    return 0;
  }
  LVar1 = plVar6->base;
  if ((LVar1 - LY_TYPE_INT8 < 8) ||
     ((LVar1 < LY_TYPE_UNION && ((0x412U >> (LVar1 & (LY_TYPE_INT32|LY_TYPE_UINT16)) & 1) != 0)))) {
    plVar2 = (plVar6->info).dec64.range;
    pcVar7 = "";
    if (val_str != (char *)0x0) {
      pcVar7 = val_str;
    }
    if (plVar2 == (lys_restr *)0x0) {
      ly_vlog(ctx,LYE_NOCONSTR,LY_VLOG_LYD,node,pcVar7,"");
    }
    else {
      ly_vlog(ctx,LYE_NOCONSTR,LY_VLOG_LYD,node,pcVar7,plVar2->expr);
      if (plVar2->emsg != (char *)0x0) {
        ly_vlog_str(ctx,LY_VLOG_PREV,plVar2->emsg);
      }
    }
    if (plVar2 == (lys_restr *)0x0) {
      return 1;
    }
    if (plVar2->eapptag == (char *)0x0) {
      return 1;
    }
    ly_err_last_set_apptag(ctx,plVar2->eapptag);
    return 1;
  }
  uVar8 = 0x249;
  local_58 = (len_ran_intv *)0x0;
  goto LAB_00126487;
}

Assistant:

static int
validate_length_range(uint8_t kind, uint64_t unum, int64_t snum, int64_t fnum, uint8_t fnum_dig, struct lys_type *type,
                      const char *val_str, struct lyd_node *node)
{
    struct lys_restr *restr = NULL;
    struct len_ran_intv *intv = NULL, *tmp_intv;
    struct lys_type *cur_type;
    struct ly_ctx *ctx = type->parent->module->ctx;
    int match;

    if (resolve_len_ran_interval(ctx, NULL, type, &intv)) {
        /* already done during schema parsing */
        LOGINT(ctx);
        return EXIT_FAILURE;
    }
    if (!intv) {
        return EXIT_SUCCESS;
    }

    /* I know that all intervals belonging to a single restriction share one type pointer */
    tmp_intv = intv;
    cur_type = intv->type;
    do {
        match = 0;
        for (; tmp_intv && (tmp_intv->type == cur_type); tmp_intv = tmp_intv->next) {
            if (match) {
                /* just iterate through the rest of this restriction intervals */
                continue;
            }

            if (((kind == 0) && (unum < tmp_intv->value.uval.min))
                    || ((kind == 1) && (snum < tmp_intv->value.sval.min))
                    || ((kind == 2) && (dec64cmp(fnum, fnum_dig, tmp_intv->value.fval.min, cur_type->info.dec64.dig) < 0))) {
                break;
            }

            if (((kind == 0) && (unum >= tmp_intv->value.uval.min) && (unum <= tmp_intv->value.uval.max))
                    || ((kind == 1) && (snum >= tmp_intv->value.sval.min) && (snum <= tmp_intv->value.sval.max))
                    || ((kind == 2) && (dec64cmp(fnum, fnum_dig, tmp_intv->value.fval.min, cur_type->info.dec64.dig) > -1)
                    && (dec64cmp(fnum, fnum_dig, tmp_intv->value.fval.max, cur_type->info.dec64.dig) < 1))) {
                match = 1;
            }
        }

        if (!match) {
            break;
        } else if (tmp_intv) {
            cur_type = tmp_intv->type;
        }
    } while (tmp_intv);

    while (intv) {
        tmp_intv = intv->next;
        free(intv);
        intv = tmp_intv;
    }

    if (!match) {
        switch (cur_type->base) {
        case LY_TYPE_BINARY:
            restr = cur_type->info.binary.length;
            break;
        case LY_TYPE_DEC64:
            restr = cur_type->info.dec64.range;
            break;
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            restr = cur_type->info.num.range;
            break;
        case LY_TYPE_STRING:
            restr = cur_type->info.str.length;
            break;
        default:
            LOGINT(ctx);
            return EXIT_FAILURE;
        }

        LOGVAL(ctx, LYE_NOCONSTR, LY_VLOG_LYD, node, (val_str ? val_str : ""), restr ? restr->expr : "");
        if (restr && restr->emsg) {
            ly_vlog_str(ctx, LY_VLOG_PREV, restr->emsg);
        }
        if (restr && restr->eapptag) {
            ly_err_last_set_apptag(ctx, restr->eapptag);
        }
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;
}